

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_clean(curl_hash *h)

{
  long lVar1;
  
  if (0 < h->slots) {
    lVar1 = 0;
    do {
      Curl_llist_destroy(h->table[lVar1],h);
      h->table[lVar1] = (curl_llist *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 < h->slots);
  }
  if (h->table != (curl_llist **)0x0) {
    (*Curl_cfree)(h->table);
    h->table = (curl_llist **)0x0;
  }
  h->size = 0;
  h->slots = 0;
  return;
}

Assistant:

void
Curl_hash_clean(struct curl_hash *h)
{
  int i;

  for(i = 0; i < h->slots; ++i) {
    Curl_llist_destroy(h->table[i], (void *) h);
    h->table[i] = NULL;
  }

  Curl_safefree(h->table);
  h->size = 0;
  h->slots = 0;
}